

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

int ma_strcpy_s(char *dst,size_t dstSizeInBytes,char *src)

{
  int iVar1;
  size_t sVar2;
  
  if (dst == (char *)0x0) {
    iVar1 = 0x16;
  }
  else {
    if (dstSizeInBytes != 0) {
      if (src == (char *)0x0) {
        iVar1 = 0x16;
      }
      else {
        iVar1 = 0x22;
        for (sVar2 = 0; dstSizeInBytes != sVar2; sVar2 = sVar2 + 1) {
          if (src[sVar2] == '\0') {
            dst = dst + sVar2;
            iVar1 = 0;
            break;
          }
          dst[sVar2] = src[sVar2];
        }
      }
      *dst = '\0';
      return iVar1;
    }
    iVar1 = 0x22;
  }
  return iVar1;
}

Assistant:

MA_API MA_NO_INLINE int ma_strcpy_s(char* dst, size_t dstSizeInBytes, const char* src)
{
    size_t i;

    if (dst == 0) {
        return 22;
    }
    if (dstSizeInBytes == 0) {
        return 34;
    }
    if (src == 0) {
        dst[0] = '\0';
        return 22;
    }

    for (i = 0; i < dstSizeInBytes && src[i] != '\0'; ++i) {
        dst[i] = src[i];
    }

    if (i < dstSizeInBytes) {
        dst[i] = '\0';
        return 0;
    }

    dst[0] = '\0';
    return 34;
}